

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-bst.c
# Opt level: O2

pboolean p_tree_bst_insert(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                          PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,ppointer key
                          ,ppointer value)

{
  pint pVar1;
  PTreeBaseNode *pPVar2;
  pboolean pVar3;
  
LAB_0011411d:
  do {
    if (((PTreeBaseNode_ *)root_node)->left == (PTreeBaseNode *)0x0) {
LAB_0011416f:
      pPVar2 = (PTreeBaseNode *)p_malloc0(0x20);
      ((PTreeBaseNode_ *)root_node)->left = pPVar2;
      if (pPVar2 == (PTreeBaseNode *)0x0) {
        pVar3 = 0;
      }
      else {
        pVar3 = 1;
LAB_00114182:
        pPVar2->key = key;
        ((PTreeBaseNode_ *)root_node)->left->value = value;
      }
      return pVar3;
    }
    pVar1 = (*compare_func)(key,((PTreeBaseNode_ *)root_node)->left->key,data);
    if (-1 < pVar1) {
      pPVar2 = ((PTreeBaseNode_ *)root_node)->left;
      if (pVar1 == 0) {
        if (pPVar2 != (PTreeBaseNode *)0x0) {
          if (key_destroy_func != (PDestroyFunc)0x0) {
            (*key_destroy_func)(pPVar2->key);
            pPVar2 = ((PTreeBaseNode_ *)root_node)->left;
          }
          pVar3 = 0;
          if (value_destroy_func != (PDestroyFunc)0x0) {
            (*value_destroy_func)(pPVar2->value);
            pPVar2 = ((PTreeBaseNode_ *)root_node)->left;
          }
          goto LAB_00114182;
        }
        goto LAB_0011416f;
      }
      root_node = &pPVar2->right;
      goto LAB_0011411d;
    }
    root_node = &((PTreeBaseNode_ *)root_node)->left->left;
  } while( true );
}

Assistant:

pboolean
p_tree_bst_insert (PTreeBaseNode	**root_node,
		   PCompareDataFunc	compare_func,
		   ppointer		data,
		   PDestroyFunc		key_destroy_func,
		   PDestroyFunc		value_destroy_func,
		   ppointer		key,
		   ppointer		value)
{
	PTreeBaseNode	**cur_node;
	pint		cmp_result;

	cur_node = root_node;

	while (*cur_node != NULL) {
		cmp_result = compare_func (key, (*cur_node)->key, data);

		if (cmp_result < 0)
			cur_node = &(*cur_node)->left;
		else if (cmp_result > 0)
			cur_node = &(*cur_node)->right;
		else
			break;
	}

	if ((*cur_node) == NULL) {
		if (P_UNLIKELY ((*cur_node = p_malloc0 (sizeof (PTreeBaseNode))) == NULL))
			return FALSE;

		(*cur_node)->key   = key;
		(*cur_node)->value = value;

		return TRUE;
	} else {
		if (key_destroy_func != NULL)
			key_destroy_func ((*cur_node)->key);

		if (value_destroy_func != NULL)
			value_destroy_func ((*cur_node)->value);

		(*cur_node)->key   = key;
		(*cur_node)->value = value;

		return FALSE;
	}
}